

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O0

ostream * amrex::operator<<(ostream *os,BoxList *blist)

{
  bool bVar1;
  IndexType IVar2;
  const_iterator it;
  ostream *poVar3;
  Long LVar4;
  ostream *poVar5;
  ulong uVar6;
  BoxList *in_RSI;
  Box *in_RDI;
  int count;
  const_iterator End;
  const_iterator bli;
  BoxList *in_stack_ffffffffffffffb8;
  int iVar7;
  ostream *in_stack_fffffffffffffff8;
  
  it = BoxList::begin(in_stack_ffffffffffffffb8);
  BoxList::end(in_stack_ffffffffffffffb8);
  poVar3 = std::operator<<((ostream *)in_RDI,"(BoxList ");
  LVar4 = BoxList::size((BoxList *)0x124c3cc);
  poVar5 = (ostream *)std::ostream::operator<<(poVar3,LVar4);
  std::operator<<(poVar5,' ');
  IVar2 = BoxList::ixType(in_RSI);
  poVar5 = operator<<((ostream *)in_RSI,(IndexType *)it._M_current);
  std::operator<<(poVar5,'\n');
  iVar7 = 1;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                             *)poVar3,
                            (__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                             *)in_stack_ffffffffffffffb8), bVar1) {
    poVar5 = (ostream *)std::ostream::operator<<(in_RDI,iVar7);
    in_stack_ffffffffffffffb8 = (BoxList *)std::operator<<(poVar5," : ");
    __gnu_cxx::
    __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator*((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
               *)&stack0xffffffffffffffe0);
    poVar5 = operator<<(in_stack_fffffffffffffff8,in_RDI);
    std::operator<<(poVar5,'\n');
    __gnu_cxx::
    __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator++((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                *)&stack0xffffffffffffffe0);
    iVar7 = iVar7 + 1;
  }
  poVar3 = std::operator<<((ostream *)in_RDI,')');
  std::operator<<(poVar3,'\n');
  uVar6 = std::ios::fail();
  if ((uVar6 & 1) != 0) {
    Error_host((char *)CONCAT44(IVar2.itype,iVar7));
  }
  return (ostream *)in_RDI;
}

Assistant:

std::ostream&
operator<< (std::ostream& os, const BoxList& blist)
{
    BoxList::const_iterator bli = blist.begin(), End = blist.end();
    os << "(BoxList " << blist.size() << ' ' << blist.ixType() << '\n';
    for (int count = 1; bli != End; ++bli, ++count)
    {
        os << count << " : " << *bli << '\n';
    }
    os << ')' << '\n';

    if (os.fail())
        amrex::Error("operator<<(ostream&,BoxList&) failed");

    return os;
}